

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O0

int __thiscall MatroskaDemuxer::ebml_read_uint(MatroskaDemuxer *this,uint32_t *id,int64_t *num)

{
  ulong uVar1;
  int iVar2;
  ostream *poVar3;
  VodCoreException *this_00;
  string local_1e8;
  ostringstream local_1b8 [8];
  ostringstream ss;
  uint64_t size;
  int64_t rlength;
  int res;
  uint n;
  int64_t *num_local;
  uint32_t *id_local;
  MatroskaDemuxer *this_local;
  
  rlength._4_4_ = 0;
  _res = (ulong *)num;
  num_local = (int64_t *)id;
  id_local = (uint32_t *)this;
  rlength._0_4_ = ebml_read_element_id(this,id,(int *)0x0);
  if (((int)rlength < 0) ||
     (rlength._0_4_ = ebml_read_element_length(this,(int64_t *)&size), (int)rlength < 0)) {
    return (int)rlength;
  }
  if ((size != 0) && (size < 9)) {
    *_res = 0;
    while (rlength._4_4_ < size) {
      uVar1 = *_res;
      rlength._4_4_ = rlength._4_4_ + 1;
      iVar2 = IOContextDemuxer::get_byte(&this->super_IOContextDemuxer);
      *_res = uVar1 << 8 | (long)iVar2;
    }
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  poVar3 = std::operator<<((ostream *)local_1b8,"Invalid uint element size ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,size);
  poVar3 = std::operator<<(poVar3," at position ");
  std::ostream::operator<<(poVar3,(this->super_IOContextDemuxer).m_processedBytes);
  this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  VodCoreException::VodCoreException(this_00,900,&local_1e8);
  __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

int MatroskaDemuxer::ebml_read_uint(uint32_t *id, int64_t *num)
{
    unsigned n = 0;
    int res;
    int64_t rlength;

    if ((res = ebml_read_element_id(id, nullptr)) < 0 || (res = ebml_read_element_length(&rlength)) < 0)
        return res;
    const uint64_t size = rlength;
    if (size < 1 || size > 8)
    {
        THROW(ERR_MATROSKA_PARSE, "Invalid uint element size " << size << " at position " << m_processedBytes)
    }

    /* big-endian ordening; build up number */
    *num = 0;
    while (n++ < size) *num = *num << 8 | get_byte();
    return 0;
}